

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::TcParser::MpVerifyUtf8
          (TcParser *this,string_view wire_bytes,TcParseTableBase *table,FieldEntry *entry,
          uint16_t xform_val)

{
  char *pcVar1;
  ushort uVar2;
  char cVar3;
  TcParseTableBase *table_00;
  undefined1 unaff_BL;
  bool bVar4;
  string_view sVar5;
  string_view message_name;
  string_view field_name;
  
  table_00 = (TcParseTableBase *)wire_bytes._M_str;
  if ((int)entry == 0x200) {
    cVar3 = utf8_range::IsStructurallyValid(this,wire_bytes._M_len);
    bVar4 = true;
    if (cVar3 != '\0') {
      return true;
    }
  }
  else {
    if ((int)entry != 0x400) {
      return true;
    }
    cVar3 = utf8_range::IsStructurallyValid(this,wire_bytes._M_len);
    if (cVar3 != '\0') {
      return true;
    }
    bVar4 = false;
  }
  pcVar1 = (char *)((long)&table_00->has_bits_offset +
                   (ulong)table_00->num_aux_entries * 8 + (ulong)table_00->aux_offset);
  uVar2 = table_00->num_field_entries;
  cVar3 = *pcVar1;
  sVar5 = FieldName(table_00,(FieldEntry *)table);
  message_name._M_str = (char *)sVar5._M_len;
  message_name._M_len = (size_t)(pcVar1 + (uVar2 + 8 & 0xfffffff8));
  field_name._M_str = "parsing";
  field_name._M_len = (size_t)sVar5._M_str;
  PrintUTF8ErrorLog((internal *)(long)cVar3,message_name,field_name,(char *)0x0,(bool)unaff_BL);
  return bVar4;
}

Assistant:

bool TcParser::MpVerifyUtf8(absl::string_view wire_bytes,
                            const TcParseTableBase* table,
                            const FieldEntry& entry, uint16_t xform_val) {
  if (xform_val == field_layout::kTvUtf8) {
    if (!utf8_range::IsStructurallyValid(wire_bytes)) {
      PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry), "parsing",
                        false);
      return false;
    }
    return true;
  }
#ifndef NDEBUG
  if (xform_val == field_layout::kTvUtf8Debug) {
    if (!utf8_range::IsStructurallyValid(wire_bytes)) {
      PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry), "parsing",
                        false);
    }
  }
#endif  // NDEBUG
  return true;
}